

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O0

string * __thiscall slang::TimeScaleValue::toString_abi_cxx11_(TimeScaleValue *this)

{
  string *in_RDI;
  string *result;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  std::__cxx11::to_string((int)((ulong)in_RDI >> 0x20));
  timeUnitToSuffix((TimeUnit)((ulong)in_RDI >> 0x38));
  std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  return in_RDI;
}

Assistant:

std::string TimeScaleValue::toString() const {
    std::string result = std::to_string(int(magnitude));
    result.append(timeUnitToSuffix(unit));
    return result;
}